

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O0

string * __thiscall FIX::SessionID::toString(SessionID *this,string *str)

{
  StringField *pSVar1;
  string *psVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *str_local;
  SessionID *this_local;
  
  local_18 = str;
  str_local = (string *)this;
  pSVar1 = &getBeginString(this)->super_StringField;
  psVar2 = StringField::getValue_abi_cxx11_(pSVar1);
  std::operator+(&local_98,psVar2,":");
  pSVar1 = &getSenderCompID(this)->super_StringField;
  psVar2 = StringField::getValue_abi_cxx11_(pSVar1);
  std::operator+(&local_78,&local_98,psVar2);
  std::operator+(&local_58,&local_78,"->");
  pSVar1 = &getTargetCompID(this)->super_StringField;
  psVar2 = StringField::getValue_abi_cxx11_(pSVar1);
  std::operator+(&local_38,&local_58,psVar2);
  std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    std::operator+(&local_c8,":",&this->m_sessionQualifier);
    std::__cxx11::string::operator+=((string *)local_18,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return local_18;
}

Assistant:

std::string &toString(std::string &str) const {
    str = getBeginString().getValue() + ":" + getSenderCompID().getValue() + "->" + getTargetCompID().getValue();
    if (m_sessionQualifier.size()) {
      str += ":" + m_sessionQualifier;
    }
    return str;
  }